

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol(char **p)

{
  char **in_RDI;
  char **in_stack_00000018;
  int64_t local_8;
  
  if (**in_RDI == '0') {
    if (((*in_RDI)[1] == 'x') || ((*in_RDI)[1] == 'X')) {
      *in_RDI = *in_RDI + 2;
      local_8 = mtree_atol16(in_stack_00000018);
    }
    else {
      local_8 = mtree_atol8(in_RDI);
    }
  }
  else {
    local_8 = mtree_atol10(in_RDI);
  }
  return local_8;
}

Assistant:

static int64_t
mtree_atol(char **p)
{
	if (**p != '0')
		return mtree_atol10(p);
	if ((*p)[1] == 'x' || (*p)[1] == 'X') {
		*p += 2;
		return mtree_atol16(p);
	}
	return mtree_atol8(p);
}